

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNM_Image.cxx
# Opt level: O3

void __thiscall Fl_PNM_Image::Fl_PNM_Image(Fl_PNM_Image *this,char *name)

{
  char cVar1;
  Fl_PNM_Image *pFVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  undefined4 extraout_var;
  long lVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  int val;
  char line [1024];
  uint local_464;
  char *local_460;
  int local_454;
  ulong local_450;
  int *local_448;
  Fl_PNM_Image *local_440;
  char local_438 [1032];
  
  Fl_RGB_Image::Fl_RGB_Image(&this->super_Fl_RGB_Image,(uchar *)0x0,0,0,3,0);
  (this->super_Fl_RGB_Image).super_Fl_Image._vptr_Fl_Image =
       (_func_int **)&PTR__Fl_RGB_Image_0027bbf8;
  local_440 = this;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    local_460 = fgets(local_438,0x400,__stream);
    if (local_460 != (char *)0x0) {
      iVar3 = atoi(local_460 + 1);
      local_450 = CONCAT44(extraout_var,iVar3);
      do {
        pcVar13 = local_460 + 1;
        local_460 = local_460 + 1;
      } while ((int)*pcVar13 - 0x30U < 10);
      if (iVar3 == 7) {
        local_460 = "";
      }
      do {
        if ((this->super_Fl_RGB_Image).super_Fl_Image.w_ != 0) {
          local_448 = &(this->super_Fl_RGB_Image).super_Fl_Image.h_;
          if (local_460 == (char *)0x0) goto LAB_0020e84b;
          goto LAB_0020e7d9;
        }
        cVar1 = *local_460;
        if ((cVar1 == '#') || (cVar1 == '\0')) {
          local_460 = fgets(local_438,0x400,__stream);
        }
        else if ((int)cVar1 - 0x30U < 10) {
          lVar5 = strtol(local_460,&local_460,10);
          (this->super_Fl_RGB_Image).super_Fl_Image.w_ = (int)lVar5;
        }
        else {
          local_460 = local_460 + 1;
        }
      } while (local_460 != (char *)0x0);
      local_448 = &(this->super_Fl_RGB_Image).super_Fl_Image.h_;
      goto LAB_0020e84b;
    }
    fclose(__stream);
    (*Fl::error)("Early end-of-file in PNM file \"%s\"!",name);
  }
  (this->super_Fl_RGB_Image).super_Fl_Image.ld_ = -2;
  return;
  while( true ) {
    cVar1 = *local_460;
    if ((cVar1 == '#') || (cVar1 == '\0')) {
      local_460 = fgets(local_438,0x400,__stream);
    }
    else if ((int)cVar1 - 0x30U < 10) {
      lVar5 = strtol(local_460,&local_460,10);
      *local_448 = (int)lVar5;
    }
    else {
      local_460 = local_460 + 1;
    }
    if (local_460 == (char *)0x0) break;
LAB_0020e7d9:
    pcVar13 = local_460;
    if (*local_448 != 0) goto LAB_0020e84e;
  }
LAB_0020e84b:
  pcVar13 = (char *)0x0;
LAB_0020e84e:
  uVar12 = 1;
  if (((int)local_450 != 1) && ((int)local_450 != 4)) {
    if (pcVar13 == (char *)0x0) {
      uVar12 = 0;
    }
    else {
      do {
        cVar1 = *pcVar13;
        if ((cVar1 == '#') || (cVar1 == '\0')) {
          local_460 = fgets(local_438,0x400,__stream);
LAB_0020e897:
          uVar12 = 0;
        }
        else {
          if (9 < (int)cVar1 - 0x30U) {
            local_460 = pcVar13 + 1;
            goto LAB_0020e897;
          }
          lVar5 = strtol(pcVar13,&local_460,10);
          uVar12 = (uint)lVar5;
        }
      } while ((local_460 != (char *)0x0) && (pcVar13 = local_460, uVar12 == 0));
    }
  }
  pFVar2 = local_440;
  uVar7 = (int)local_450 - 1;
  local_450 = (ulong)uVar7;
  uVar9 = 3;
  if (uVar7 < 5) {
    uVar9 = *(uint *)(&DAT_00243dc8 + (ulong)uVar7 * 4);
  }
  (local_440->super_Fl_RGB_Image).super_Fl_Image.d_ = uVar9;
  iVar3 = (local_440->super_Fl_RGB_Image).super_Fl_Image.w_;
  iVar4 = (local_440->super_Fl_RGB_Image).super_Fl_Image.h_;
  uVar11 = (ulong)uVar9 * (long)iVar4 * (long)iVar3;
  if (uVar11 < Fl_RGB_Image::max_size_ || uVar11 - Fl_RGB_Image::max_size_ == 0) {
    puVar6 = (uchar *)operator_new__((long)(int)(iVar3 * iVar4 * uVar9));
    (pFVar2->super_Fl_RGB_Image).array = puVar6;
    (pFVar2->super_Fl_RGB_Image).alloc_array = 1;
    if (0 < iVar4) {
      local_454 = 0;
      do {
        if ((uint)local_450 < 7) {
          iVar3 = (local_440->super_Fl_RGB_Image).super_Fl_Image.w_;
          iVar4 = (local_440->super_Fl_RGB_Image).super_Fl_Image.d_;
          iVar10 = iVar4 * iVar3;
          puVar6 = (local_440->super_Fl_RGB_Image).array + iVar10 * local_454;
          switch((long)&switchD_0020e9c2::switchdataD_00243dac +
                 (long)(int)(&switchD_0020e9c2::switchdataD_00243dac)[local_450]) {
          case 0x20e9c4:
            if ((int)uVar12 < 0x100) {
              fread(puVar6,(long)iVar3,(long)iVar4,__stream);
            }
            else if (0 < iVar10) {
              uVar9 = iVar10 + 1;
              do {
                local_464 = getc(__stream);
                local_464 = local_464 & 0xff;
                uVar8 = local_464 << 8;
                uVar7 = getc(__stream);
                local_464 = uVar7 & 0xff | uVar8;
                *puVar6 = (uchar)((local_464 * 0xff) / uVar12);
                puVar6 = puVar6 + 1;
                uVar9 = uVar9 - 1;
              } while (1 < uVar9);
            }
            break;
          case 0x20ea2f:
            if (0 < iVar3) {
              iVar3 = iVar3 + 1;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%d",&local_464);
                if (iVar4 == 1) {
                  *puVar6 = (uchar)((int)(local_464 * 0xff) / (int)uVar12);
                  puVar6 = puVar6 + 1;
                }
                iVar4 = __isoc99_fscanf(__stream,"%d",&local_464);
                if (iVar4 == 1) {
                  *puVar6 = (uchar)((int)(local_464 * 0xff) / (int)uVar12);
                  puVar6 = puVar6 + 1;
                }
                iVar4 = __isoc99_fscanf(__stream,"%d",&local_464);
                if (iVar4 == 1) {
                  *puVar6 = (uchar)((int)(local_464 * 0xff) / (int)uVar12);
                  puVar6 = puVar6 + 1;
                }
                iVar3 = iVar3 + -1;
              } while (1 < iVar3);
            }
            break;
          case 0x20ead9:
            uVar9 = getc(__stream);
            if (0 < iVar3) {
              iVar3 = iVar3 + 1;
              uVar7 = 0x80;
              do {
                *puVar6 = -((uVar9 & 0xff & uVar7) == 0);
                if (uVar7 < 2) {
                  if (iVar3 == 2) break;
                  uVar9 = getc(__stream);
                  uVar7 = 0x80;
                }
                else {
                  uVar7 = uVar7 >> 1;
                }
                puVar6 = puVar6 + 1;
                iVar3 = iVar3 + -1;
              } while (1 < iVar3);
            }
            break;
          case 0x20eb35:
            if (0 < iVar3) {
              iVar3 = iVar3 + 1;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%d",&local_464);
                if (iVar4 == 1) {
                  *puVar6 = (char)local_464 + 0xff;
                  puVar6 = puVar6 + 1;
                }
                iVar3 = iVar3 + -1;
              } while (1 < iVar3);
            }
            break;
          case 0x20eb72:
            if (0 < iVar3) {
              iVar3 = iVar3 + 1;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%d",&local_464);
                if (iVar4 == 1) {
                  *puVar6 = (uchar)((int)(local_464 * 0xff) / (int)uVar12);
                  puVar6 = puVar6 + 1;
                }
                iVar3 = iVar3 + -1;
              } while (1 < iVar3);
            }
            break;
          case 0x20ebb5:
            if (0 < iVar3) {
              uVar9 = iVar3 + 1;
              do {
                uVar7 = getc(__stream);
                *puVar6 = (uchar)((uVar7 >> 5 & 7) * 0x246e6d >> 0x10);
                puVar6[1] = (uchar)((uVar7 >> 2 & 7) * 0x246e6d >> 0x10);
                puVar6[2] = ((byte)uVar7 & 3) * 'U';
                puVar6 = puVar6 + 3;
                uVar9 = uVar9 - 1;
              } while (1 < uVar9);
            }
          }
        }
        local_454 = local_454 + 1;
      } while (local_454 < *local_448);
    }
    fclose(__stream);
  }
  else {
    (*Fl::warning)("PNM file \"%s\" is too large!\n",name);
    fclose(__stream);
    (pFVar2->super_Fl_RGB_Image).super_Fl_Image.w_ = 0;
    (pFVar2->super_Fl_RGB_Image).super_Fl_Image.h_ = 0;
    (pFVar2->super_Fl_RGB_Image).super_Fl_Image.d_ = 0;
    (pFVar2->super_Fl_RGB_Image).super_Fl_Image.ld_ = -3;
  }
  return;
}

Assistant:

Fl_PNM_Image::Fl_PNM_Image(const char *name)	// I - File to read
  : Fl_RGB_Image(0,0,0) {
  FILE		*fp;		// File pointer
  int		x, y;		// Looping vars
  char		line[1024],	// Input line
		*lineptr;	// Pointer in line
  uchar		*ptr,		// Pointer to pixel values
		byte,		// Byte from file
		bit;		// Bit in pixel
  int		format,		// Format of PNM file
		val,		// Pixel value
		maxval;		// Maximum pixel value


  if ((fp = fl_fopen(name, "rb")) == NULL) {
    ld(ERR_FILE_ACCESS);
    return;
  }

  //
  // Read the file header in the format:
  //
  //   Pformat
  //   # comment1
  //   # comment2
  //   ...
  //   # commentN
  //   width
  //   height
  //   max sample
  //

  lineptr = fgets(line, sizeof(line), fp);
  if (!lineptr) {
    fclose(fp);
    Fl::error("Early end-of-file in PNM file \"%s\"!", name);
    ld(ERR_FILE_ACCESS);
    return;
  }

  lineptr ++;

  format = atoi(lineptr);
  while (isdigit(*lineptr)) lineptr ++;

  if (format == 7) lineptr = (char *)"";

  while (lineptr != NULL && w() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      w(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  while (lineptr != NULL && h() == 0) {
    if (*lineptr == '\0' || *lineptr == '#') {
      lineptr = fgets(line, sizeof(line), fp);
    } else if (isdigit(*lineptr)) {
      h(strtol(lineptr, &lineptr, 10));
    } else lineptr ++;
  }

  if (format != 1 && format != 4) {
    maxval = 0;

    while (lineptr != NULL && maxval == 0) {
      if (*lineptr == '\0' || *lineptr == '#') {
	lineptr = fgets(line, sizeof(line), fp);
      } else if (isdigit(*lineptr)) {
	maxval = strtol(lineptr, &lineptr, 10);
      } else lineptr ++;
    }
  } else maxval = 1;

  // Allocate memory...
  if (format == 1 || format == 2 || format == 4 || format == 5) d(1);
  else d(3);

//  printf("%s = %dx%dx%d\n", name, w(), h(), d());

  if (((size_t)w()) * h() * d() > max_size() ) {
    Fl::warning("PNM file \"%s\" is too large!\n", name);
    fclose(fp);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  array       = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Read the image file...
  for (y = 0; y < h(); y ++) {
    ptr = (uchar *)array + y * w() * d();

    switch (format) {
      case 1 :
        for (x = w(); x > 0; x --)
          if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * (1-val));
        break;
        
      case 2 :
          for (x = w(); x > 0; x --)
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          break;

      case 3 :
          for (x = w(); x > 0; x --) {
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
            if (fscanf(fp, "%d", &val) == 1) *ptr++ = (uchar)(255 * val / maxval);
          }
          break;

      case 4 :
        for (x = w(), byte = (uchar)getc(fp), bit = 128; x > 0; x --) {
          if ((byte & bit) == 0) *ptr++ = 255; // 0 bit for white pixel
          else *ptr++ = 0; // 1 bit for black pixel
          
          if (bit > 1) bit >>= 1;
          else {
            bit  = 128;
            if (x > 1) byte = (uchar)getc(fp);
          }
        }
        break;
          
      case 5 :
      case 6 :
        if (maxval < 256) {
          if (fread(ptr, w(), d(), fp)) { /* ignored */ }
        } else {
          for (x = d() * w(); x > 0; x --) {
            val = (uchar)getc(fp);
            val = (val<<8)|(uchar)getc(fp);
            *ptr++ = (255*val)/maxval;
          }
        }
        break;
        
      case 7 : /* XV 3:3:2 thumbnail format */
        for (x = w(); x > 0; x --) {
          byte = (uchar)getc(fp);
          
          *ptr++ = (uchar)(255 * ((byte >> 5) & 7) / 7);
          *ptr++ = (uchar)(255 * ((byte >> 2) & 7) / 7);
          *ptr++ = (uchar)(255 * (byte & 3) / 3);
        }
        break;
    }
  }

  fclose(fp);
}